

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_parser.cpp
# Opt level: O1

void __thiscall
ArgParser::add(ArgParser *this,uint *var,string *name,string *shortName,string *description,uint mn,
              uint mx,bool optional)

{
  pointer pcVar1;
  pointer pAVar2;
  int iVar3;
  string local_90;
  string local_70;
  string local_50;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + name->_M_string_length);
  pcVar1 = (shortName->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + shortName->_M_string_length);
  pcVar1 = (description->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + description->_M_string_length);
  add(this,var,&local_90,&local_50,&local_70,optional);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  pAVar2 = (this->m_args).super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar3 = (int)((ulong)((long)(this->m_args).
                              super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pAVar2) >> 5) * -0x49249249
          + -1;
  pAVar2[iVar3].minUINT = mn;
  pAVar2[iVar3].maxUINT = mx;
  pAVar2[iVar3].checkRange = true;
  return;
}

Assistant:

void ArgParser::add(unsigned int *var,
                    std::string name, std::string shortName, std::string description,
                    unsigned int mn, unsigned int mx,
                    bool optional)
{
    add(var, name, shortName, description, optional);
    int ind = m_args.size() - 1;
    m_args[ind].minUINT = mn;
    m_args[ind].maxUINT = mx;
    m_args[ind].checkRange = true;
}